

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t str_countwords(char *src)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *src_00;
  size_t sVar3;
  
  if (src == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    src_00 = src + -1;
    do {
      pcVar1 = src_00 + 1;
      src_00 = src_00 + 1;
    } while (((*ppuVar2)[*pcVar1] & 1) != 0);
    sVar3 = 0;
    for (; (src_00 != (char *)0x0 && (*src_00 != '\0')); src_00 = str_skipnextword(src_00)) {
      sVar3 = sVar3 + 1;
    }
  }
  return sVar3;
}

Assistant:

size_t
str_countwords(const char *src) {
  size_t count = 0;

  /* sanity check */
  if (src != NULL) {
    /* skip whitespace prefix */
    while (isblank(*src)) {
      src++;
    }

    while (src != NULL && *src != 0) {
      count++;

      src = str_skipnextword(src);
    }
  }
  return count;
}